

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void clask::sort_handlers(node *n)

{
  pointer p_Var1;
  long lVar2;
  ulong uVar3;
  _node *v;
  pointer p_Var4;
  
  p_Var4 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var1 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (p_Var4 != p_Var1) {
    uVar3 = ((long)p_Var1 - (long)p_Var4 >> 5) * -0x3333333333333333;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<clask::_node*,std::vector<clask::_node,std::allocator<clask::_node>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<clask::sort_handlers(clask::_node&)::_lambda(clask::_node_const&,clask::_node_const&)_1_>>
              (p_Var4,p_Var1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<clask::_node*,std::vector<clask::_node,std::allocator<clask::_node>>>,__gnu_cxx::__ops::_Iter_comp_iter<clask::sort_handlers(clask::_node&)::_lambda(clask::_node_const&,clask::_node_const&)_1_>>
              (p_Var4,p_Var1);
  }
  p_Var1 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (p_Var4 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>.
                _M_impl.super__Vector_impl_data._M_start; p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
    sort_handlers(p_Var4);
  }
  return;
}

Assistant:

inline void sort_handlers(node& n) {
  std::sort(
    n.children.begin(),
    n.children.end(),
    [](const node& x, const node& y){ return x.name > y.name; }
  );
  for (auto& v : n.children) {
    sort_handlers(v);
  }
}